

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::ParsedScene::Material(ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  pointer pcVar1;
  FileLoc loc_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary dict;
  SceneEntity local_1f8;
  ParameterDictionary local_158;
  ParameterDictionary local_f0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_88;
  
  if (this->currentBlock != OptionsBlock) {
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_88,in_RDX);
    ParameterDictionary::ParameterDictionary
              (&local_f0,&local_88,&(this->graphicsState).materialAttributes,
               (this->graphicsState).colorSpace);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_88);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_158.params,&local_f0.params);
    local_158.colorSpace = local_f0.colorSpace;
    loc_00.filename._M_str = (char *)params.ptr;
    loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
    loc_00._16_8_ = params.field_2.fixed[0];
    SceneEntity::SceneEntity(&local_1f8,name,&local_158,loc_00);
    std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::
    emplace_back<pbrt::SceneEntity>(&this->materials,&local_1f8);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_1f8.parameters.params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
      operator_delete(local_1f8.name._M_dataplus._M_p,
                      local_1f8.name.field_2._M_allocated_capacity + 1);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_158.params);
    pcVar1 = (this->graphicsState).currentMaterialName._M_dataplus._M_p;
    (this->graphicsState).currentMaterialIndex =
         (int)((ulong)((long)(this->materials).
                             super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->materials).
                            super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x33333333 + -1;
    (this->graphicsState).currentMaterialName._M_string_length = 0;
    *pcVar1 = '\0';
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_f0.params);
    return;
  }
  ErrorExit<char_const(&)[9]>
            ((FileLoc *)&params,
             "Scene description must be inside world block; \"%s\" is not allowed.",
             (char (*) [9])0x2c8570c);
}

Assistant:

void ParsedScene::Material(const std::string &name, ParsedParameterVector params,
                           FileLoc loc) {
    VERIFY_WORLD("Material");
    ParameterDictionary dict(std::move(params), graphicsState.materialAttributes,
                             graphicsState.colorSpace);
    materials.push_back(SceneEntity(name, std::move(dict), loc));
    graphicsState.currentMaterialIndex = materials.size() - 1;
    graphicsState.currentMaterialName.clear();
}